

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDF::makeIndirectObject(QPDF *this,QPDFObjectHandle *oh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  logic_error *this_01;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (*in_RDX != 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    QVar2 = makeIndirectFromQPDFObject(this,(shared_ptr<QPDFObject> *)oh);
    _Var1._M_pi = QVar2.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var1._M_pi = extraout_RDX;
    }
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var1._M_pi;
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_01,"attempted to make an uninitialized QPDFObjectHandle indirect");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFObjectHandle
QPDF::readObjectInStream(is::OffsetBuffer& input, int stream_id, int obj_id)
{
    auto [object, empty] = QPDFParser::parse(input, stream_id, obj_id, m->tokenizer, *this);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(QPDFExc(
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(stream_id),
            +"object " + std::to_string(obj_id) + " 0, offset " +
                std::to_string(input.getLastOffset()),
            0,
            "empty object treated as null"));
    }
    return object;
}